

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testVec.cpp
# Opt level: O0

void anon_unknown.dwarf_97a80::testLength4T<double>(void)

{
  bool bVar1;
  double dVar2;
  double t;
  Vec4<double> v;
  double e;
  double s;
  undefined4 in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  double in_stack_fffffffffffffad0;
  Vec4<double> *in_stack_fffffffffffffad8;
  Vec4<double> *in_stack_fffffffffffffae8;
  Vec4<double> local_4d8 [2];
  Vec4<double> local_498 [2];
  Vec4<double> local_458 [2];
  Vec4<double> local_418 [2];
  Vec4<double> local_3d8 [2];
  Vec4<double> local_398 [2];
  Vec4<double> local_358 [2];
  Vec4<double> local_318 [2];
  Vec4<double> local_2d8 [2];
  Vec4<double> local_298 [2];
  Vec4<double> local_258 [2];
  Vec4<double> local_218 [2];
  Vec4<double> local_1d8 [2];
  Vec4<double> local_198;
  double local_178;
  Vec4<double> local_150 [2];
  Vec4<double> local_110 [2];
  Vec4<double> local_d0 [2];
  Vec4<double> local_90 [2];
  Vec4<double> local_50;
  Vec4<double> local_30;
  double local_10;
  double local_8;
  
  dVar2 = Imath_2_5::limits<double>::smallest();
  local_8 = Imath_2_5::Math<double>::sqrt(dVar2);
  local_10 = Imath_2_5::limits<double>::epsilon();
  local_10 = local_10 * 4.0;
  Imath_2_5::Vec4<double>::Vec4(&local_30);
  Imath_2_5::Vec4<double>::Vec4(&local_50,0.0,0.0,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,&local_50);
  dVar2 = Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("v.length() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xc6,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  dVar2 = Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("v.normalized().length() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,199,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_90,3.0,4.0,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_90);
  dVar2 = Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  if ((dVar2 != 5.0) || (NAN(dVar2))) {
    __assert_fail("v.length() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xca,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21154889751402e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xcb,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_d0,3000.0,4000.0,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_d0);
  dVar2 = Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  if ((dVar2 != 5000.0) || (NAN(dVar2))) {
    __assert_fail("v.length() == 5000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xce,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21258643537029e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xcf,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_110,1.0,-1.0,1.0,1.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_110);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21321389874051e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), 2, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xd2,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21366843913468e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xd3,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_150,1000.0,-1000.0,1000.0,1000.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_150);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21433542775657e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), 2000, 1000 * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xd6,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21478996815074e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xd7,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  local_178 = local_8 * 16.0;
  Imath_2_5::Vec4<double>::Vec4(&local_198,local_178,0.0,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,&local_198);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.215590354497e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xdc,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21604489489118e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xdd,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_1d8,0.0,local_178,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_1d8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.21671682416952e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xdf,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21717136456369e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe0,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_218,0.0,0.0,local_178,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_218);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.21784329384204e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe2,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21829783423621e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe3,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_258,0.0,0.0,0.0,local_178);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_258);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.21896976351456e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe5,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.21942430390873e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe6,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_298,-local_178,-local_178,-local_178,-local_178);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_298);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.22067923064917e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe8,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.22113377104334e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xe9,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  local_178 = local_8 / 16.0;
  Imath_2_5::Vec4<double>::Vec4(local_2d8,local_178,0.0,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_2d8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.22195392001544e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xee,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.22240846040961e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xef,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_318,0.0,local_178,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_318);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.22308038968796e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf1,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.22353493008213e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf2,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_358,0.0,0.0,local_178,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_358);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.22420685936047e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf4,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.22466139975465e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf5,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_398,0.0,0.0,0.0,local_178);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_398);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.22533332903299e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf7,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.22578786942717e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xf8,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_3d8,-local_178,-local_178,-local_178,-local_178);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_3d8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.2270427961676e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xfa,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.22749733656178e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xfb,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  local_178 = local_8 / 1048576.0;
  Imath_2_5::Vec4<double>::Vec4(local_418,local_178,0.0,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_418);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.22831748553387e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x100,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.22877202592805e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x101,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_458,0.0,local_178,0.0,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_458);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.22944395520639e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x103,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.22989849560056e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x104,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_498,0.0,0.0,local_178,0.0);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_498);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.23057042487891e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x106,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.23102496527308e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x107,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4(local_4d8,0.0,0.0,0.0,local_178);
  Imath_2_5::Vec4<double>::operator=(&local_30,local_4d8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.23166725061268e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x109,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.2320921470681e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x10a,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::Vec4
            ((Vec4<double> *)&stack0xfffffffffffffae8,-local_178,-local_178,-local_178,-local_178);
  Imath_2_5::Vec4<double>::operator=(&local_30,(Vec4<double> *)&stack0xfffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffad0,
                     (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     8.23331742986979e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x10c,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  Imath_2_5::Vec4<double>::normalized(in_stack_fffffffffffffae8);
  Imath_2_5::Vec4<double>::length(in_stack_fffffffffffffad8);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,8.23372256369938e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x10d,"void (anonymous namespace)::testLength4T() [T = double]");
  }
  return;
}

Assistant:

void
testLength4T ()
{
    const T s = Math<T>::sqrt (limits<T>::smallest());
    const T e = 4 * limits<T>::epsilon();

    Vec4<T> v;

    v = Vec4<T> (0, 0, 0, 0);
    assert (v.length() == 0);
    assert (v.normalized().length() == 0);

    v = Vec4<T> (3, 4, 0, 0);
    assert (v.length() == 5);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec4<T> (3000, 4000, 0, 0);
    assert (v.length() == 5000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec4<T> (1, -1, 1, 1);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), 2, e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec4<T> (1000, -1000, 1000, 1000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), 2000, 1000 * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    T t = s * (1 << 4);

    v = Vec4<T> (t, 0, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (-t, -t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    t = s / (1 << 4);

    v = Vec4<T> (t, 0, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (-t, -t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    t = s / (1 << 20);

    v = Vec4<T> (t, 0, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (0, 0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec4<T> (-t, -t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * 2, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
}